

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__bmp_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi__uint32 sVar1;
  stbi__uint32 sVar2;
  stbi_uc sVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  uint uVar9;
  uint local_520;
  uint local_51c;
  uint local_518;
  uint local_514;
  stbi_uc *p2;
  stbi_uc *p1;
  stbi_uc t;
  uint a_1;
  stbi__uint32 v_2;
  int bpp;
  int iStack_4e4;
  uchar a;
  int easy;
  int z_1;
  int acount;
  int bcount;
  int gcount;
  int rcount;
  int ashift;
  int bshift;
  int gshift;
  int rshift;
  int v2;
  int v_1;
  int color;
  int v;
  int bit_offset;
  int z;
  stbi__bmp_data info;
  int target;
  int pad;
  int flip_vertically;
  int width;
  int j;
  int i;
  int psize;
  stbi_uc pal [256] [4];
  uint local_5c;
  uint all_a;
  uint ma;
  uint mb;
  uint mg;
  uint mr;
  stbi_uc *out;
  stbi__result_info *ri_local;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  j = 0;
  info.mb = 0xff;
  pvVar8 = stbi__bmp_parse_header(s,(stbi__bmp_data *)&bit_offset);
  if (pvVar8 == (void *)0x0) {
    s_local = (stbi__context *)0x0;
  }
  else {
    sVar1 = s->img_y;
    sVar2 = s->img_y;
    if ((int)sVar2 < 1) {
      sVar2 = -sVar2;
    }
    s->img_y = sVar2;
    if (s->img_y < 0x1000001) {
      if (s->img_x < 0x1000001) {
        local_5c = info.mb;
        if (info.bpp == 0xc) {
          if (bit_offset < 0x18) {
            j = (int)((z - info.ma) + -0x18) / 3;
          }
        }
        else if (bit_offset < 0x10) {
          j = (int)((z - info.ma) - info.bpp) >> 2;
        }
        if ((j == 0) &&
           ((stbi_uc *)(long)z !=
            s->img_buffer + ((long)s->callback_already_read - (long)s->img_buffer_original))) {
          stbi__err("bad offset");
          s_local = (stbi__context *)0x0;
        }
        else {
          if ((bit_offset == 0x18) && (info.mg == 0xff000000)) {
            s->img_n = 3;
          }
          else {
            iVar5 = 3;
            if (info.mg != 0) {
              iVar5 = 4;
            }
            s->img_n = iVar5;
          }
          if ((req_comp == 0) || (info.all_a = req_comp, req_comp < 3)) {
            info.all_a = s->img_n;
          }
          iVar5 = stbi__mad3sizes_valid(info.all_a,s->img_x,s->img_y,0);
          if (iVar5 == 0) {
            stbi__err("too large");
            s_local = (stbi__context *)0x0;
          }
          else {
            _mg = (stbi__context *)stbi__malloc_mad3(info.all_a,s->img_x,s->img_y,0);
            if (_mg == (stbi__context *)0x0) {
              stbi__err("outofmem");
              s_local = (stbi__context *)0x0;
            }
            else {
              if (bit_offset < 0x10) {
                v = 0;
                if ((j == 0) || (0x100 < j)) {
                  free(_mg);
                  stbi__err("invalid");
                  return (void *)0x0;
                }
                for (width = 0; width < j; width = width + 1) {
                  sVar3 = stbi__get8(s);
                  *(stbi_uc *)((long)&i + (long)width * 4 + 2) = sVar3;
                  sVar3 = stbi__get8(s);
                  *(stbi_uc *)((long)&i + (long)width * 4 + 1) = sVar3;
                  sVar3 = stbi__get8(s);
                  *(stbi_uc *)(&i + width) = sVar3;
                  if (info.bpp != 0xc) {
                    stbi__get8(s);
                  }
                  *(undefined1 *)((long)&i + (long)width * 4 + 3) = 0xff;
                }
                iVar5 = 4;
                if (info.bpp == 0xc) {
                  iVar5 = 3;
                }
                stbi__skip(s,((z - info.ma) - info.bpp) - j * iVar5);
                if (bit_offset == 1) {
                  pad = s->img_x + 7 >> 3;
                }
                else if (bit_offset == 4) {
                  pad = s->img_x + 1 >> 1;
                }
                else {
                  if (bit_offset != 8) {
                    free(_mg);
                    stbi__err("bad bpp");
                    return (void *)0x0;
                  }
                  pad = s->img_x;
                }
                info.extra_read = -pad & 3;
                if (bit_offset == 1) {
                  for (flip_vertically = 0; flip_vertically < (int)s->img_y;
                      flip_vertically = flip_vertically + 1) {
                    color = 7;
                    bVar4 = stbi__get8(s);
                    v_1 = (int)bVar4;
                    for (width = 0; width < (int)s->img_x; width = width + 1) {
                      uVar6 = v_1 >> ((byte)color & 0x1f) & 1;
                      _mg->buffer_start[(long)v + -0x38] = (stbi_uc)(&i)[(int)uVar6];
                      _mg->buffer_start[(long)(v + 1) + -0x38] =
                           *(stbi_uc *)((long)&i + (long)(int)uVar6 * 4 + 1);
                      _mg->buffer_start[(long)(v + 2) + -0x38] =
                           *(stbi_uc *)((long)&i + (long)(int)uVar6 * 4 + 2);
                      iVar5 = v + 3;
                      if (info.all_a == 4) {
                        _mg->buffer_start[(long)(v + 3) + -0x38] = 0xff;
                        iVar5 = v + 4;
                      }
                      v = iVar5;
                      if (width + 1U == s->img_x) break;
                      color = color + -1;
                      if (color < 0) {
                        color = 7;
                        bVar4 = stbi__get8(s);
                        v_1 = (int)bVar4;
                      }
                    }
                    stbi__skip(s,info.extra_read);
                  }
                }
                else {
                  for (flip_vertically = 0; flip_vertically < (int)s->img_y;
                      flip_vertically = flip_vertically + 1) {
                    for (width = 0; width < (int)s->img_x; width = width + 2) {
                      bVar4 = stbi__get8(s);
                      rshift = (int)bVar4;
                      gshift = 0;
                      if (bit_offset == 4) {
                        gshift = rshift & 0xf;
                        rshift = rshift >> 4;
                      }
                      _mg->buffer_start[(long)v + -0x38] = (stbi_uc)(&i)[rshift];
                      _mg->buffer_start[(long)(v + 1) + -0x38] =
                           *(stbi_uc *)((long)&i + (long)rshift * 4 + 1);
                      _mg->buffer_start[(long)(v + 2) + -0x38] =
                           *(stbi_uc *)((long)&i + (long)rshift * 4 + 2);
                      iVar5 = v + 3;
                      if (info.all_a == 4) {
                        _mg->buffer_start[(long)(v + 3) + -0x38] = 0xff;
                        iVar5 = v + 4;
                      }
                      v = iVar5;
                      if (width + 1U == s->img_x) break;
                      if (bit_offset == 8) {
                        bVar4 = stbi__get8(s);
                        local_514 = (uint)bVar4;
                      }
                      else {
                        local_514 = gshift;
                      }
                      _mg->buffer_start[(long)v + -0x38] = (stbi_uc)(&i)[(int)local_514];
                      _mg->buffer_start[(long)(v + 1) + -0x38] =
                           *(stbi_uc *)((long)&i + (long)(int)local_514 * 4 + 1);
                      _mg->buffer_start[(long)(v + 2) + -0x38] =
                           *(stbi_uc *)((long)&i + (long)(int)local_514 * 4 + 2);
                      iVar5 = v + 3;
                      if (info.all_a == 4) {
                        _mg->buffer_start[(long)(v + 3) + -0x38] = 0xff;
                        iVar5 = v + 4;
                      }
                      v = iVar5;
                    }
                    stbi__skip(s,info.extra_read);
                  }
                }
              }
              else {
                bshift = 0;
                ashift = 0;
                rcount = 0;
                gcount = 0;
                bcount = 0;
                acount = 0;
                z_1 = 0;
                easy = 0;
                iStack_4e4 = 0;
                bpp = 0;
                stbi__skip(s,(z - info.ma) - info.bpp);
                if (bit_offset == 0x18) {
                  pad = s->img_x * 3;
                }
                else if (bit_offset == 0x10) {
                  pad = s->img_x << 1;
                }
                else {
                  pad = 0;
                }
                info.extra_read = -pad & 3;
                if (bit_offset == 0x18) {
                  bpp = 1;
                }
                else if ((((bit_offset == 0x20) && (info.mr == 0xff)) && (info.hsz == 0xff00)) &&
                        ((info.offset == 0xff0000 && (info.mg == 0xff000000)))) {
                  bpp = 2;
                }
                if (bpp == 0) {
                  if (((info.offset == 0) || (info.hsz == 0)) || (info.mr == 0)) {
                    free(_mg);
                    stbi__err("bad masks");
                    return (void *)0x0;
                  }
                  iVar5 = stbi__high_bit(info.offset);
                  bshift = iVar5 + -7;
                  bcount = stbi__bitcount(info.offset);
                  iVar5 = stbi__high_bit(info.hsz);
                  ashift = iVar5 + -7;
                  acount = stbi__bitcount(info.hsz);
                  iVar5 = stbi__high_bit(info.mr);
                  rcount = iVar5 + -7;
                  z_1 = stbi__bitcount(info.mr);
                  iVar5 = stbi__high_bit(info.mg);
                  gcount = iVar5 + -7;
                  easy = stbi__bitcount(info.mg);
                  if ((((8 < bcount) || (8 < acount)) || (8 < z_1)) || (8 < easy)) {
                    free(_mg);
                    stbi__err("bad masks");
                    return (void *)0x0;
                  }
                }
                for (flip_vertically = 0; iVar5 = bit_offset, flip_vertically < (int)s->img_y;
                    flip_vertically = flip_vertically + 1) {
                  if (bpp == 0) {
                    for (width = 0; width < (int)s->img_x; width = width + 1) {
                      if (iVar5 == 0x10) {
                        local_51c = stbi__get16le(s);
                      }
                      else {
                        local_51c = stbi__get32le(s);
                      }
                      iVar7 = stbi__shiftsigned(local_51c & info.offset,bshift,bcount);
                      _mg->buffer_start[(long)iStack_4e4 + -0x38] = (stbi_uc)iVar7;
                      iVar7 = stbi__shiftsigned(local_51c & info.hsz,ashift,acount);
                      _mg->buffer_start[(long)(iStack_4e4 + 1) + -0x38] = (stbi_uc)iVar7;
                      iVar7 = stbi__shiftsigned(local_51c & info.mr,rcount,z_1);
                      _mg->buffer_start[(long)(iStack_4e4 + 2) + -0x38] = (stbi_uc)iVar7;
                      if (info.mg == 0) {
                        local_520 = 0xff;
                      }
                      else {
                        local_520 = stbi__shiftsigned(local_51c & info.mg,gcount,easy);
                      }
                      local_5c = local_520 | local_5c;
                      iVar7 = iStack_4e4 + 3;
                      if (info.all_a == 4) {
                        _mg->buffer_start[(long)(iStack_4e4 + 3) + -0x38] = (stbi_uc)local_520;
                        iVar7 = iStack_4e4 + 4;
                      }
                      iStack_4e4 = iVar7;
                    }
                  }
                  else {
                    for (width = 0; width < (int)s->img_x; width = width + 1) {
                      sVar3 = stbi__get8(s);
                      _mg->buffer_start[(long)(iStack_4e4 + 2) + -0x38] = sVar3;
                      sVar3 = stbi__get8(s);
                      _mg->buffer_start[(long)(iStack_4e4 + 1) + -0x38] = sVar3;
                      sVar3 = stbi__get8(s);
                      _mg->buffer_start[(long)iStack_4e4 + -0x38] = sVar3;
                      if (bpp == 2) {
                        bVar4 = stbi__get8(s);
                        local_518 = (uint)bVar4;
                      }
                      else {
                        local_518 = 0xff;
                      }
                      local_5c = local_518 | local_5c;
                      iVar5 = iStack_4e4 + 3;
                      if (info.all_a == 4) {
                        _mg->buffer_start[(long)(iStack_4e4 + 3) + -0x38] = (stbi_uc)local_518;
                        iVar5 = iStack_4e4 + 4;
                      }
                      iStack_4e4 = iVar5;
                    }
                  }
                  stbi__skip(s,info.extra_read);
                }
              }
              if ((info.all_a == 4) && (local_5c == 0)) {
                for (width = s->img_x * 4 * s->img_y + -1; -1 < width; width = width + -4) {
                  _mg->buffer_start[(long)width + -0x38] = 0xff;
                }
              }
              if (0 < (int)sVar1) {
                for (flip_vertically = 0; flip_vertically < (int)s->img_y >> 1;
                    flip_vertically = flip_vertically + 1) {
                  uVar6 = flip_vertically * s->img_x * info.all_a;
                  uVar9 = ((s->img_y - 1) - flip_vertically) * s->img_x * info.all_a;
                  for (width = 0; width < (int)(s->img_x * info.all_a); width = width + 1) {
                    sVar3 = _mg->buffer_start[(long)width + (ulong)uVar6 + -0x38];
                    _mg->buffer_start[(long)width + (ulong)uVar6 + -0x38] =
                         _mg->buffer_start[(long)width + (ulong)uVar9 + -0x38];
                    _mg->buffer_start[(long)width + (ulong)uVar9 + -0x38] = sVar3;
                  }
                }
              }
              if (((req_comp == 0) || (req_comp == info.all_a)) ||
                 (_mg = (stbi__context *)
                        stbi__convert_format((uchar *)_mg,info.all_a,req_comp,s->img_x,s->img_y),
                 s_local = _mg, _mg != (stbi__context *)0x0)) {
                *x = s->img_x;
                *y = s->img_y;
                if (comp != (int *)0x0) {
                  *comp = s->img_n;
                }
                s_local = _mg;
              }
            }
          }
        }
      }
      else {
        stbi__err("too large");
        s_local = (stbi__context *)0x0;
      }
    }
    else {
      stbi__err("too large");
      s_local = (stbi__context *)0x0;
    }
  }
  return s_local;
}

Assistant:

static void *stbi__bmp_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   stbi_uc *out;
   unsigned int mr=0,mg=0,mb=0,ma=0, all_a;
   stbi_uc pal[256][4];
   int psize=0,i,j,width;
   int flip_vertically, pad, target;
   stbi__bmp_data info;
   STBI_NOTUSED(ri);

   info.all_a = 255;
   if (stbi__bmp_parse_header(s, &info) == NULL)
      return NULL; // error code already set

   flip_vertically = ((int) s->img_y) > 0;
   s->img_y = abs((int) s->img_y);

   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   mr = info.mr;
   mg = info.mg;
   mb = info.mb;
   ma = info.ma;
   all_a = info.all_a;

   if (info.hsz == 12) {
      if (info.bpp < 24)
         psize = (info.offset - info.extra_read - 24) / 3;
   } else {
      if (info.bpp < 16)
         psize = (info.offset - info.extra_read - info.hsz) >> 2;
   }
   if (psize == 0) {
      if (info.offset != s->callback_already_read + (s->img_buffer - s->img_buffer_original)) {
        return stbi__errpuc("bad offset", "Corrupt BMP");
      }
   }

   if (info.bpp == 24 && ma == 0xff000000)
      s->img_n = 3;
   else
      s->img_n = ma ? 4 : 3;
   if (req_comp && req_comp >= 3) // we can directly decode 3 or 4
      target = req_comp;
   else
      target = s->img_n; // if they want monochrome, we'll post-convert

   // sanity-check size
   if (!stbi__mad3sizes_valid(target, s->img_x, s->img_y, 0))
      return stbi__errpuc("too large", "Corrupt BMP");

   out = (stbi_uc *) stbi__malloc_mad3(target, s->img_x, s->img_y, 0);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   if (info.bpp < 16) {
      int z=0;
      if (psize == 0 || psize > 256) { STBI_FREE(out); return stbi__errpuc("invalid", "Corrupt BMP"); }
      for (i=0; i < psize; ++i) {
         pal[i][2] = stbi__get8(s);
         pal[i][1] = stbi__get8(s);
         pal[i][0] = stbi__get8(s);
         if (info.hsz != 12) stbi__get8(s);
         pal[i][3] = 255;
      }
      stbi__skip(s, info.offset - info.extra_read - info.hsz - psize * (info.hsz == 12 ? 3 : 4));
      if (info.bpp == 1) width = (s->img_x + 7) >> 3;
      else if (info.bpp == 4) width = (s->img_x + 1) >> 1;
      else if (info.bpp == 8) width = s->img_x;
      else { STBI_FREE(out); return stbi__errpuc("bad bpp", "Corrupt BMP"); }
      pad = (-width)&3;
      if (info.bpp == 1) {
         for (j=0; j < (int) s->img_y; ++j) {
            int bit_offset = 7, v = stbi__get8(s);
            for (i=0; i < (int) s->img_x; ++i) {
               int color = (v>>bit_offset)&0x1;
               out[z++] = pal[color][0];
               out[z++] = pal[color][1];
               out[z++] = pal[color][2];
               if (target == 4) out[z++] = 255;
               if (i+1 == (int) s->img_x) break;
               if((--bit_offset) < 0) {
                  bit_offset = 7;
                  v = stbi__get8(s);
               }
            }
            stbi__skip(s, pad);
         }
      } else {
         for (j=0; j < (int) s->img_y; ++j) {
            for (i=0; i < (int) s->img_x; i += 2) {
               int v=stbi__get8(s),v2=0;
               if (info.bpp == 4) {
                  v2 = v & 15;
                  v >>= 4;
               }
               out[z++] = pal[v][0];
               out[z++] = pal[v][1];
               out[z++] = pal[v][2];
               if (target == 4) out[z++] = 255;
               if (i+1 == (int) s->img_x) break;
               v = (info.bpp == 8) ? stbi__get8(s) : v2;
               out[z++] = pal[v][0];
               out[z++] = pal[v][1];
               out[z++] = pal[v][2];
               if (target == 4) out[z++] = 255;
            }
            stbi__skip(s, pad);
         }
      }
   } else {
      int rshift=0,gshift=0,bshift=0,ashift=0,rcount=0,gcount=0,bcount=0,acount=0;
      int z = 0;
      int easy=0;
      stbi__skip(s, info.offset - info.extra_read - info.hsz);
      if (info.bpp == 24) width = 3 * s->img_x;
      else if (info.bpp == 16) width = 2*s->img_x;
      else /* bpp = 32 and pad = 0 */ width=0;
      pad = (-width) & 3;
      if (info.bpp == 24) {
         easy = 1;
      } else if (info.bpp == 32) {
         if (mb == 0xff && mg == 0xff00 && mr == 0x00ff0000 && ma == 0xff000000)
            easy = 2;
      }
      if (!easy) {
         if (!mr || !mg || !mb) { STBI_FREE(out); return stbi__errpuc("bad masks", "Corrupt BMP"); }
         // right shift amt to put high bit in position #7
         rshift = stbi__high_bit(mr)-7; rcount = stbi__bitcount(mr);
         gshift = stbi__high_bit(mg)-7; gcount = stbi__bitcount(mg);
         bshift = stbi__high_bit(mb)-7; bcount = stbi__bitcount(mb);
         ashift = stbi__high_bit(ma)-7; acount = stbi__bitcount(ma);
         if (rcount > 8 || gcount > 8 || bcount > 8 || acount > 8) { STBI_FREE(out); return stbi__errpuc("bad masks", "Corrupt BMP"); }
      }
      for (j=0; j < (int) s->img_y; ++j) {
         if (easy) {
            for (i=0; i < (int) s->img_x; ++i) {
               unsigned char a;
               out[z+2] = stbi__get8(s);
               out[z+1] = stbi__get8(s);
               out[z+0] = stbi__get8(s);
               z += 3;
               a = (easy == 2 ? stbi__get8(s) : 255);
               all_a |= a;
               if (target == 4) out[z++] = a;
            }
         } else {
            int bpp = info.bpp;
            for (i=0; i < (int) s->img_x; ++i) {
               stbi__uint32 v = (bpp == 16 ? (stbi__uint32) stbi__get16le(s) : stbi__get32le(s));
               unsigned int a;
               out[z++] = STBI__BYTECAST(stbi__shiftsigned(v & mr, rshift, rcount));
               out[z++] = STBI__BYTECAST(stbi__shiftsigned(v & mg, gshift, gcount));
               out[z++] = STBI__BYTECAST(stbi__shiftsigned(v & mb, bshift, bcount));
               a = (ma ? stbi__shiftsigned(v & ma, ashift, acount) : 255);
               all_a |= a;
               if (target == 4) out[z++] = STBI__BYTECAST(a);
            }
         }
         stbi__skip(s, pad);
      }
   }

   // if alpha channel is all 0s, replace with all 255s
   if (target == 4 && all_a == 0)
      for (i=4*s->img_x*s->img_y-1; i >= 0; i -= 4)
         out[i] = 255;

   if (flip_vertically) {
      stbi_uc t;
      for (j=0; j < (int) s->img_y>>1; ++j) {
         stbi_uc *p1 = out +      j     *s->img_x*target;
         stbi_uc *p2 = out + (s->img_y-1-j)*s->img_x*target;
         for (i=0; i < (int) s->img_x*target; ++i) {
            t = p1[i]; p1[i] = p2[i]; p2[i] = t;
         }
      }
   }

   if (req_comp && req_comp != target) {
      out = stbi__convert_format(out, target, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = s->img_n;
   return out;
}